

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temp-getelement2.cpp
# Opt level: O1

Object * ICM::getIdentData(Element *elt)

{
  uint8_t uVar1;
  size_t sVar2;
  byte bVar3;
  Object *pOVar4;
  FuncTableUnit *pFVar5;
  size_t *psVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar1 = (elt->field_0).field_0.stype;
  bVar3 = (elt->field_0).field_0.etype ^ 3;
  if (uVar1 == '\x04' && bVar3 == 0) {
    pOVar4 = getDyVarbData(elt);
    return pOVar4;
  }
  if (uVar1 == '\x01' && bVar3 == 0) {
    pOVar4 = getConstData(elt);
    return pOVar4;
  }
  if (uVar1 == '\x02' && bVar3 == 0) {
    pOVar4 = (Object *)operator_new(0x10);
    pFVar5 = getStFunc(elt);
    sVar2 = pFVar5->id;
    pOVar4->type = 0xb;
    pOVar4->data = (DataPointer)0x0;
    psVar6 = (size_t *)operator_new(0x10);
    *psVar6 = sVar2;
    psVar6[1] = 0xffffffffffffffff;
  }
  else {
    if (bVar3 != 0 || uVar1 != '\a') {
      return (Object *)0x0;
    }
    pOVar4 = (Object *)operator_new(0x10);
    uVar8 = (ulong)(uint)elt->index;
    uVar7 = (DAT_00153800 - DAT_001537f8 >> 3) * -0x5555555555555555;
    if (uVar7 < uVar8 || uVar7 - uVar8 == 0) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    sVar2 = *(size_t *)
             (**(long **)(DAT_001537f8 + 0x10 + uVar8 * 0x18) + 0x18 +
             (ulong)*(uint *)((long)&elt->index + 4) * 0x20);
    pOVar4->type = 0xe;
    pOVar4->data = (DataPointer)0x0;
    psVar6 = (size_t *)operator_new(8);
    *psVar6 = sVar2;
  }
  pOVar4->data = psVar6;
  return pOVar4;
}

Assistant:

Object* getIdentData(const Instruction::Element &elt) {
		if (elt.isIdentType(I_DyVarb)) {
			return getDyVarbData(elt);
		}
		else if (elt.isIdentType(I_Data)) {
			return getConstData(elt);
		}
		else if (elt.isIdentType(I_StFunc)) {
			return new Objects::Function(getStFunc(elt).getID());
		}
		else if (elt.isIdentType(I_Type)) {
			return new Objects::Type(getFromIdentTable(elt.getIdentIndex()).TypeIndex);
		}
		return nullptr;
	}